

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void set_morale_flag_screen_attributes(tgestate_t *state,attribute_t attrs)

{
  undefined1 in_SIL;
  int *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint8_t *in_stack_00000008;
  int iters;
  attribute_t *pattrs;
  int local_1c;
  undefined1 *local_18;
  
  local_18 = (undefined1 *)(*(long *)(in_RDI + 6) + 0x1872);
  local_1c = 0x13;
  do {
    *local_18 = in_SIL;
    local_18[1] = in_SIL;
    local_18[2] = in_SIL;
    local_18 = local_18 + *in_RDI;
    local_1c = local_1c + -1;
  } while (local_1c != 0);
  invalidate_attrs((tgestate_t *)pattrs,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void set_morale_flag_screen_attributes(tgestate_t *state, attribute_t attrs)
{
  attribute_t *pattrs; /* was HL */
  int          iters;  /* was B */

  assert(state != NULL);
  assert(attrs >= attribute_BLUE_OVER_BLACK && attrs <= attribute_BRIGHT_WHITE_OVER_BLACK);

  pattrs = &state->speccy->screen.attributes[morale_flag_attributes_offset];
  iters = 19; /* Height of flag. */
  do
  {
    pattrs[0] = attrs;
    pattrs[1] = attrs;
    pattrs[2] = attrs;
    pattrs += state->width;
  }
  while (--iters);

  /* Conv: Invalidation added over the original game. */
  invalidate_attrs(state,
                   &state->speccy->screen.attributes[morale_flag_attributes_offset],
                   3 * 8, 19 * 8);
}